

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cc
# Opt level: O1

void __thiscall tt::net::TimerManager::handleExpiredEvent(TimerManager *this)

{
  _Elt_pointer psVar1;
  TimerNode *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar2;
  
  do {
    psVar1 = (this->timerNodeQueue).c.
             super__Deque_base<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->timerNodeQueue).c.
        super__Deque_base<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == psVar1) {
      return;
    }
    this_00 = (psVar1->super___shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_01 = (psVar1->super___shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    if ((this_00->deleted_ == false) && (bVar2 = TimerNode::isValid(this_00), bVar2)) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      std::
      priority_queue<std::shared_ptr<tt::net::TimerNode>,_std::deque<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>,_tt::net::TimerCmp>
      ::pop(&this->timerNodeQueue);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  } while (bVar2);
  return;
}

Assistant:

void TimerManager::handleExpiredEvent() {
  // MutexLockGuard locker(lock);
  while (!timerNodeQueue.empty()) {
    SPTimerNode ptimer_now = timerNodeQueue.top();
    if (ptimer_now->isDeleted())
      timerNodeQueue.pop();
    else if (ptimer_now->isValid() == false)
      timerNodeQueue.pop();
    else
      break;
  }
}